

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFAContentModel.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DFAContentModel::checkUniqueParticleAttribution
          (DFAContentModel *this,SchemaGrammar *pGrammar,GrammarResolver *pGrammarResolver,
          XMLStringPool *pStringPool,XMLValidator *pValidator,uint *pContentSpecOrgURI,
          XMLCh *pComplexTypeName)

{
  uint uVar1;
  QName **ppQVar2;
  Occurence *pOVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  XMLCh *pXVar7;
  ulong uVar8;
  QName *q2;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  XMLBuffer buf2;
  XMLBuffer buf1;
  ConflictTableKeeper keeper;
  SubstitutionGroupComparator comparator;
  char **__s;
  
  uVar6 = this->fElemMapSize;
  ppQVar2 = this->fElemMap;
  for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
    uVar1 = ppQVar2[uVar8]->fURIId;
    if (uVar1 < 0xfffffffe && (uVar1 != 0xfffffff2 && uVar1 != 0xfffffff1)) {
      ppQVar2[uVar8]->fURIId = pContentSpecOrgURI[uVar1];
    }
  }
  comparator.fGrammarResolver = pGrammarResolver;
  comparator.fStringPool = pStringPool;
  iVar5 = (*this->fMemoryManager->_vptr_MemoryManager[3])();
  __s = (char **)CONCAT44(extraout_var,iVar5);
  memset(__s,0,(ulong)this->fElemMapSize << 3);
  keeper.fMemoryManager = this->fMemoryManager;
  uVar6 = this->fElemMapSize;
  keeper.fConflictTable = __s;
  keeper.fElemMapSize = uVar6;
  for (uVar8 = 0; uVar8 < uVar6; uVar8 = uVar8 + 1) {
    iVar5 = (*this->fMemoryManager->_vptr_MemoryManager[3])();
    __s[uVar8] = (char *)CONCAT44(extraout_var_00,iVar5);
    memset((char *)CONCAT44(extraout_var_00,iVar5),0,(ulong)this->fElemMapSize);
    uVar6 = this->fElemMapSize;
  }
  uVar8 = 0;
  do {
    if (this->fTransTableSize <= uVar8) {
      checkUniqueParticleAttribution::ConflictTableKeeper::~ConflictTableKeeper(&keeper);
      return;
    }
    uVar10 = 1;
    for (uVar9 = 0; uVar9 < uVar6; uVar9 = uVar9 + 1) {
      uVar11 = uVar10;
      if (this->fTransTable[uVar8][uVar9] != 0xffffffff) {
        for (; uVar11 < uVar6; uVar11 = uVar11 + 1) {
          if ((this->fTransTable[uVar8][uVar11] != 0xffffffff) && (__s[uVar9][uVar11] == '\0')) {
            ppQVar2 = this->fElemMap;
            if (this->fIsMixed == false) {
              q2 = ppQVar2[uVar11];
            }
            else if ((ppQVar2[uVar9]->fURIId == 0xffffffff) ||
                    (q2 = ppQVar2[uVar11], q2->fURIId == 0xffffffff)) goto LAB_002e48b3;
            bVar4 = XercesElementWildcard::conflict
                              (pGrammar,this->fElemMapType[uVar9],ppQVar2[uVar9],
                               this->fElemMapType[uVar11],q2,&comparator);
            if ((bVar4) &&
               ((((this->fCountingStates == (Occurence **)0x0 ||
                  (pOVar3 = this->fCountingStates[uVar8], pOVar3 == (Occurence *)0x0)) ||
                 ((uVar8 == this->fTransTable[uVar8][uVar9]) ==
                  (uVar8 == this->fTransTable[uVar8][uVar11]))) ||
                (pOVar3->minOccurs != pOVar3->maxOccurs)))) {
              __s[uVar9][uVar11] = '\x01';
              buf1.fMemoryManager = this->fMemoryManager;
              buf1.fIndex = 0;
              buf1.fCapacity = 0x3ff;
              buf1.fFullSize = 0;
              buf1.fUsed = false;
              buf1.fFullHandler = (XMLBufferFullHandler *)0x0;
              buf1.fBuffer = (XMLCh *)0x0;
              iVar5 = (*(buf1.fMemoryManager)->_vptr_MemoryManager[3])(buf1.fMemoryManager,0x800);
              buf1.fBuffer = (XMLCh *)CONCAT44(extraout_var_01,iVar5);
              *buf1.fBuffer = L'\0';
              uVar6 = (this->fElemMapType[uVar9] & (Any_NS|Any_Other)) + ~Sequence;
              if (uVar6 < 3) {
                XMLBuffer::set(&buf1,(XMLCh *)(&PTR_fgATTVAL_TWOPOUNDANY_00404ef8)[uVar6]);
              }
              else {
                pXVar7 = QName::getRawName(this->fElemMap[uVar9]);
                XMLBuffer::set(&buf1,pXVar7);
              }
              buf2.fMemoryManager = this->fMemoryManager;
              buf2.fIndex = 0;
              buf2.fCapacity = 0x3ff;
              buf2.fFullSize = 0;
              buf2.fUsed = false;
              buf2.fFullHandler = (XMLBufferFullHandler *)0x0;
              buf2.fBuffer = (XMLCh *)0x0;
              iVar5 = (*(buf2.fMemoryManager)->_vptr_MemoryManager[3])(buf2.fMemoryManager,0x800);
              buf2.fBuffer = (XMLCh *)CONCAT44(extraout_var_02,iVar5);
              *buf2.fBuffer = L'\0';
              uVar6 = (this->fElemMapType[uVar11] & (Any_NS|Any_Other)) + ~Sequence;
              if (uVar6 < 3) {
                XMLBuffer::set(&buf2,(XMLCh *)(&PTR_fgATTVAL_TWOPOUNDANY_00404ef8)[uVar6]);
              }
              else {
                pXVar7 = QName::getRawName(this->fElemMap[uVar11]);
                XMLBuffer::set(&buf2,pXVar7);
              }
              buf1.fBuffer[buf1.fIndex] = L'\0';
              buf2.fBuffer[buf2.fIndex] = L'\0';
              XMLValidator::emitError
                        (pValidator,UniqueParticleAttributionFail,pComplexTypeName,buf1.fBuffer,
                         buf2.fBuffer,(XMLCh *)0x0);
              XMLBuffer::~XMLBuffer(&buf2);
              XMLBuffer::~XMLBuffer(&buf1);
            }
            else {
              __s[uVar9][uVar11] = -1;
            }
          }
LAB_002e48b3:
          uVar6 = this->fElemMapSize;
        }
      }
      uVar10 = uVar10 + 1;
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void DFAContentModel::checkUniqueParticleAttribution (SchemaGrammar*    const pGrammar,
                                                      GrammarResolver*  const pGrammarResolver,
                                                      XMLStringPool*    const pStringPool,
                                                      XMLValidator*     const pValidator,
                                                      unsigned int*     const pContentSpecOrgURI,
                                                      const XMLCh*            pComplexTypeName /*= 0*/)
{

    SubstitutionGroupComparator comparator(pGrammarResolver, pStringPool);

    unsigned int i, j, k;

    // Rename the URI back
    for (i = 0; i < fElemMapSize; i++) {

        unsigned int orgURIIndex = fElemMap[i]->getURI();

        if ((orgURIIndex != XMLContentModel::gEOCFakeId) &&
            (orgURIIndex != XMLContentModel::gEpsilonFakeId) &&
            (orgURIIndex != XMLElementDecl::fgInvalidElemId) &&
            (orgURIIndex != XMLElementDecl::fgPCDataElemId)) {
            fElemMap[i]->setURI(pContentSpecOrgURI[orgURIIndex]);
        }
    }

    // Unique Particle Attribution
    // Store the conflict results between any two elements in fElemMap
    // 0 - not yet tested, 1 - conflict, (-1) - no conflict
    signed char** conflictTable = (signed char**) fMemoryManager->allocate
    (
        fElemMapSize * sizeof(signed char*)
    );
    memset(conflictTable, 0, fElemMapSize * sizeof(signed char*));

    struct ConflictTableKeeper
    {
        MemoryManager* fMemoryManager;
        signed char**  fConflictTable;
        unsigned int   fElemMapSize;

        ConflictTableKeeper(MemoryManager* memoryManager,
                            signed char** conflictTable,
                            unsigned int elemMapSize):
            fMemoryManager(memoryManager),
            fConflictTable(conflictTable),
            fElemMapSize(elemMapSize)
        {
        }

        ~ConflictTableKeeper()
        {
            for (int i = 0; i < fElemMapSize; i++)
                fMemoryManager->deallocate(fConflictTable[i]);
            fMemoryManager->deallocate(fConflictTable);
        }
    };

    ConflictTableKeeper keeper(fMemoryManager, conflictTable, fElemMapSize);

    // initialize the conflict table
    for (j = 0; j < fElemMapSize; j++) {
        conflictTable[j] = (signed char*) fMemoryManager->allocate
        (
            fElemMapSize * sizeof(signed char)
        );
        memset(conflictTable[j], 0, fElemMapSize*sizeof(signed char));
    }

    // for each state, check whether it has overlap transitions
    for (i = 0; i < fTransTableSize; i++) {
        for (j = 0; j < fElemMapSize; j++) {
            if (fTransTable[i][j] == XMLContentModel::gInvalidTrans)
                continue;
            for (k = j+1; k < fElemMapSize; k++) {
                if (fTransTable[i][k] != XMLContentModel::gInvalidTrans &&
                    conflictTable[j][k] == 0) {

                    // If this is text in a Schema mixed content model, skip it.
                    if ( fIsMixed &&
                         (( fElemMap[j]->getURI() == XMLElementDecl::fgPCDataElemId) ||
                          ( fElemMap[k]->getURI() == XMLElementDecl::fgPCDataElemId)))
                        continue;

                    if (XercesElementWildcard::conflict(pGrammar,
                                                        fElemMapType[j],
                                                        fElemMap[j],
                                                        fElemMapType[k],
                                                        fElemMap[k],
                                                        &comparator)) {
                        if (fCountingStates != 0) {
                            Occurence* o = fCountingStates[i];
                            // If "i" is a counting state and exactly one of the transitions
                            // loops back to "i" then the two particles do not overlap if
                            // minOccurs == maxOccurs.
                            if (o != 0 &&
                                ((fTransTable[i][j] == i) ^ (fTransTable[i][k] == i)) &&
                                o->minOccurs == o->maxOccurs) {
                                conflictTable[j][k] = -1;
                                continue;
                            }
                        }
                       conflictTable[j][k] = 1;

                       XMLBuffer buf1(1023, fMemoryManager);
                       if (((fElemMapType[j] & 0x0f) == ContentSpecNode::Any) ||
                           ((fElemMapType[j] & 0x0f) == ContentSpecNode::Any_NS))
                           buf1.set(SchemaSymbols::fgATTVAL_TWOPOUNDANY);
                       else if ((fElemMapType[j] & 0x0f) == ContentSpecNode::Any_Other)
                           buf1.set(SchemaSymbols::fgATTVAL_TWOPOUNDOTHER);
                       else
                           buf1.set(fElemMap[j]->getRawName());

                       XMLBuffer buf2(1023, fMemoryManager);
                       if (((fElemMapType[k] & 0x0f) == ContentSpecNode::Any) ||
                           ((fElemMapType[k] & 0x0f) == ContentSpecNode::Any_NS))
                           buf2.set(SchemaSymbols::fgATTVAL_TWOPOUNDANY);
                       else if ((fElemMapType[k] & 0x0f) == ContentSpecNode::Any_Other)
                           buf2.set(SchemaSymbols::fgATTVAL_TWOPOUNDOTHER);
                       else
                           buf2.set(fElemMap[k]->getRawName());

                       pValidator->emitError(XMLValid::UniqueParticleAttributionFail,
                                             pComplexTypeName,
                                             buf1.getRawBuffer(),
                                             buf2.getRawBuffer());
                    }
                    else
                        conflictTable[j][k] = -1;
                }
            }
        }
    }
}